

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nghttp2_hd.c
# Opt level: O1

int hd_context_init(nghttp2_hd_context *context,nghttp2_mem *mem)

{
  nghttp2_hd_entry **ppnVar1;
  int iVar2;
  
  context->mem = mem;
  context->bad = '\0';
  context->hd_table_bufsize_max = 0x1000;
  ppnVar1 = (nghttp2_hd_entry **)nghttp2_mem_malloc(mem,0x400);
  (context->hd_table).buffer = ppnVar1;
  if (ppnVar1 == (nghttp2_hd_entry **)0x0) {
    iVar2 = -0x385;
  }
  else {
    (context->hd_table).mask = 0x7f;
    (context->hd_table).first = 0;
    (context->hd_table).len = 0;
    context->hd_table_bufsize = 0;
    context->next_seq = 0;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

static int hd_context_init(nghttp2_hd_context *context, nghttp2_mem *mem) {
  int rv;
  context->mem = mem;
  context->bad = 0;
  context->hd_table_bufsize_max = NGHTTP2_HD_DEFAULT_MAX_BUFFER_SIZE;
  rv = hd_ringbuf_init(
      &context->hd_table,
      context->hd_table_bufsize_max / NGHTTP2_HD_ENTRY_OVERHEAD, mem);
  if (rv != 0) {
    return rv;
  }

  context->hd_table_bufsize = 0;
  context->next_seq = 0;

  return 0;
}